

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

void If_LibBoxFree(If_LibBox_t *p)

{
  Vec_Ptr_t *__ptr;
  long lVar1;
  
  if (p != (If_LibBox_t *)0x0) {
    __ptr = p->vBoxes;
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        if ((If_Box_t *)__ptr->pArray[lVar1] != (If_Box_t *)0x0) {
          If_BoxFree((If_Box_t *)__ptr->pArray[lVar1]);
          __ptr = p->vBoxes;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    free(p);
    return;
  }
  return;
}

Assistant:

void If_LibBoxFree( If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    If_LibBoxForEachBox( p, pBox, i )
        If_BoxFree( pBox );
    Vec_PtrFree( p->vBoxes );
    ABC_FREE( p );
}